

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O1

void inner_update_cb_post(update_data *d,float x,float *wref)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = ABS(x);
  fVar1 = d->update;
  if (wref[3] <= fVar2 && fVar2 != wref[3]) {
    wref[3] = fVar2;
  }
  fVar2 = ABS(d->update);
  if (wref[5] <= fVar2 && fVar2 != wref[5]) {
    if (fVar2 <= d->ftrl_beta) {
      fVar2 = d->ftrl_beta;
    }
    wref[5] = fVar2;
  }
  fVar3 = wref[3] * wref[5];
  fVar2 = 0.0;
  if (0.0 < fVar3) {
    fVar2 = ((d->ftrl_alpha + wref[4]) * wref[1]) / ((wref[2] + fVar3) * fVar3);
  }
  *wref = fVar2;
  fVar1 = fVar1 * x;
  wref[1] = wref[1] - fVar1;
  wref[2] = ABS(fVar1) + wref[2];
  wref[4] = wref[4] - fVar1 * fVar2;
  return;
}

Assistant:

void inner_update_cb_post(update_data& d, float x, float& wref)
{
  float* w = &wref;
  float fabs_x = fabs(x);
  float gradient = d.update * x;

  if (fabs_x > w[W_MX]) {
    w[W_MX] = fabs_x;
  }

  float fabs_gradient = fabs(d.update);
  if (fabs_gradient > w[W_MG])
    w[W_MG] = fabs_gradient>d.ftrl_beta?fabs_gradient:d.ftrl_beta;

  // COCOB update without sigmoid.
  // If a new Lipschitz constant and/or magnitude of x is found, the w is
  // recalculated and used in the update of the wealth below.
  if (w[W_MG]*w[W_MX]>0)
    w[W_XT] = (d.ftrl_alpha+w[W_WE]) * w[W_ZT]/(w[W_MG]*w[W_MX]*(w[W_MG]*w[W_MX]+w[W_G2]));
  else
    w[W_XT] = 0;

  w[W_ZT] += -gradient;
  w[W_G2] += fabs(gradient);
  w[W_WE] += (-gradient*w[W_XT]);
}